

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rmlLinkedMap.c
# Opt level: O1

void * rmlLinkedMapRemove(void *self,char *key)

{
  void *item;
  rmlLinkedMapKeyValuePair_ *self_00;
  void *pvVar1;
  rmlLinkedMapGetEachCallbackAttachment_ attachment;
  char *local_38;
  undefined8 uStack_30;
  void *local_28;
  
  uStack_30 = 0;
  local_28 = (void *)0x0;
  local_38 = key;
  rmlLinkedListEach(self,rmlLinkedMapGetPairItemEachCallback,&local_38);
  item = local_28;
  self_00 = (rmlLinkedMapKeyValuePair_ *)rmlLinkedListItemGetValue(local_28);
  if (self_00 == (rmlLinkedMapKeyValuePair_ *)0x0) {
    pvVar1 = (void *)0x0;
  }
  else {
    pvVar1 = self_00->value;
  }
  rmlLinkedMapKeyValuePairDestroy(self_00);
  rmlLinkedListRemoveItem(self,item);
  return pvVar1;
}

Assistant:

void *rmlLinkedMapRemove(void *self, char *key) {
    void *item = rmlLinkedMapGetPairItem(self, key);
    struct rmlLinkedMapKeyValuePair_ *pair = rmlLinkedListItemGetValue(item);

    void *value = pair != NULL ? pair->value : NULL;

    rmlLinkedMapKeyValuePairDestroy(pair);
    rmlLinkedListRemoveItem(self, item);
    return value;
}